

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnFuncType
          (BinaryReaderObjdump *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  long lVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  string local_50;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    printf(" - type[%u] (",CONCAT44(in_register_00000034,index));
    if (param_count != 0) {
      lVar1 = 0;
      do {
        if (lVar1 != 0) {
          printf(", ");
        }
        Type::GetName_abi_cxx11_(&local_50,(Type *)((long)&param_types->enum_ + lVar1));
        printf("%s",local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar1 = lVar1 + 8;
      } while ((ulong)param_count << 3 != lVar1);
    }
    printf(") -> ");
    if (result_count == 0) {
      printf("nil");
    }
    else if (result_count == 1) {
      Type::GetName_abi_cxx11_(&local_50,result_types);
      printf("%s",local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      putchar(0x28);
      uVar2 = 0;
      do {
        if (uVar2 != 0) {
          printf(", ");
        }
        Type::GetName_abi_cxx11_(&local_50,result_types);
        printf("%s",local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar2 = uVar2 + 1;
        result_types = result_types + 1;
      } while (result_count != uVar2);
      putchar(0x29);
    }
    putchar(10);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnFuncType(Index index,
                                       Index param_count,
                                       Type* param_types,
                                       Index result_count,
                                       Type* result_types) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (", index);
  for (Index i = 0; i < param_count; i++) {
    if (i != 0) {
      printf(", ");
    }
    printf("%s", param_types[i].GetName().c_str());
  }
  printf(") -> ");
  switch (result_count) {
    case 0:
      printf("nil");
      break;
    case 1:
      printf("%s", result_types[0].GetName().c_str());
      break;
    default:
      printf("(");
      for (Index i = 0; i < result_count; i++) {
        if (i != 0) {
          printf(", ");
        }
        printf("%s", result_types[i].GetName().c_str());
      }
      printf(")");
      break;
  }
  printf("\n");
  return Result::Ok;
}